

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bech32.c
# Opt level: O0

_Bool check_addr_segwit(void)

{
  int iVar1;
  _Bool _Var2;
  _Bool is_success;
  size_t sStack_30;
  int ret;
  size_t written2;
  size_t written;
  uchar *mem2;
  uchar *mem;
  
  mem2 = (uchar *)calloc(0x5a,1);
  if (mem2 == (uchar *)0x0) {
    mem._7_1_ = false;
  }
  else {
    written = (size_t)calloc(0x5a,1);
    if ((void *)written == (void *)0x0) {
      free(mem2);
      mem._7_1_ = false;
    }
    else {
      iVar1 = wally_addr_segwit_to_bytes
                        ("BC1QW508D6QEJXTDG4Y5R3ZARVARY0C5XW7KV8F3T4","bc",0,mem2,0x5a,&written2);
      _Var2 = iVar1 == 0;
      iVar1 = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6",written,0x5a,
                                 &stack0xffffffffffffffd0);
      if (((iVar1 != 0) || (written2 != sStack_30)) ||
         (iVar1 = memcmp(mem2,(void *)written,written2), iVar1 != 0)) {
        _Var2 = false;
      }
      iVar1 = wally_addr_segwit_to_bytes
                        ("tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7","tb",0,
                         mem2,0x5a,&written2);
      if (iVar1 != 0) {
        _Var2 = false;
      }
      iVar1 = wally_hex_to_bytes("00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262"
                                 ,written,0x5a,&stack0xffffffffffffffd0);
      if (((iVar1 != 0) || (written2 != sStack_30)) ||
         (iVar1 = memcmp(mem2,(void *)written,written2), iVar1 != 0)) {
        _Var2 = false;
      }
      iVar1 = wally_addr_segwit_to_bytes
                        ("bc1pw508d6qejxtdg4y5r3zarvary0c5xw7kw508d6qejxtdg4y5r3zarvary0c5xw7kt5nd6y"
                         ,"bc",0,mem2,0x5a,&written2);
      if (iVar1 != 0) {
        _Var2 = false;
      }
      iVar1 = wally_hex_to_bytes("5128751e76e8199196d454941c45d1b3a323f1433bd6751e76e8199196d454941c45d1b3a323f1433bd6"
                                 ,written,0x5a,&stack0xffffffffffffffd0);
      if (((iVar1 != 0) || (written2 != sStack_30)) ||
         (iVar1 = memcmp(mem2,(void *)written,written2), iVar1 != 0)) {
        _Var2 = false;
      }
      iVar1 = wally_addr_segwit_to_bytes("BC1SW50QGDZ25J","bc",0,mem2,0x5a,&written2);
      if (iVar1 != 0) {
        _Var2 = false;
      }
      iVar1 = wally_hex_to_bytes("6002751e",written,0x5a,&stack0xffffffffffffffd0);
      if (((iVar1 != 0) || (written2 != sStack_30)) ||
         (iVar1 = memcmp(mem2,(void *)written,written2), iVar1 != 0)) {
        _Var2 = false;
      }
      iVar1 = wally_addr_segwit_to_bytes
                        ("bc1zw508d6qejxtdg4y5r3zarvaryvaxxpcs","bc",0,mem2,0x5a,&written2);
      if (iVar1 != 0) {
        _Var2 = false;
      }
      iVar1 = wally_hex_to_bytes("5210751e76e8199196d454941c45d1b3a323",written,0x5a,
                                 &stack0xffffffffffffffd0);
      if (((iVar1 != 0) || (written2 != sStack_30)) ||
         (iVar1 = memcmp(mem2,(void *)written,written2), iVar1 != 0)) {
        _Var2 = false;
      }
      iVar1 = wally_addr_segwit_to_bytes
                        ("tb1qqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesrxh6hy","tb",0,
                         mem2,0x5a,&written2);
      if (iVar1 != 0) {
        _Var2 = false;
      }
      iVar1 = wally_hex_to_bytes("0020000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433"
                                 ,written,0x5a,&stack0xffffffffffffffd0);
      if (((iVar1 != 0) || (written2 != sStack_30)) ||
         (iVar1 = memcmp(mem2,(void *)written,written2), iVar1 != 0)) {
        _Var2 = false;
      }
      iVar1 = wally_addr_segwit_to_bytes
                        ("tb1pqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesf3hn0c","tb",0,
                         mem2,0x5a,&written2);
      if (iVar1 != 0) {
        _Var2 = false;
      }
      iVar1 = wally_hex_to_bytes("5120000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433"
                                 ,written,0x5a,&stack0xffffffffffffffd0);
      if (((iVar1 != 0) || (written2 != sStack_30)) ||
         (iVar1 = memcmp(mem2,(void *)written,written2), iVar1 != 0)) {
        _Var2 = false;
      }
      iVar1 = wally_addr_segwit_to_bytes
                        ("bc1p0xlxvlhemja6c4dqv22uapctqupfhlxm9h8z3k2e72q4k9hcz7vqzk5jj0","bc",0,
                         mem2,0x5a,&written2);
      if (iVar1 != 0) {
        _Var2 = false;
      }
      iVar1 = wally_hex_to_bytes("512079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798"
                                 ,written,0x5a,&stack0xffffffffffffffd0);
      if (((iVar1 != 0) || (written2 != sStack_30)) ||
         (iVar1 = memcmp(mem2,(void *)written,written2), iVar1 != 0)) {
        _Var2 = false;
      }
      free(mem2);
      free((void *)written);
      mem._7_1_ = _Var2;
    }
  }
  return mem._7_1_;
}

Assistant:

static bool check_addr_segwit(void)
{
    unsigned char *mem;
    unsigned char *mem2;
    size_t written;
    size_t written2;
    int ret;
    bool is_success = true;

    mem = calloc(90, sizeof(unsigned char));
    if (!mem)
        return false;

    mem2 = calloc(90, sizeof(unsigned char));
    if (!mem2) {
        free(mem);
        return false;
    }

    ret = wally_addr_segwit_to_bytes(
        "BC1QW508D6QEJXTDG4Y5R3ZARVARY0C5XW7KV8F3T4",
        "bc", 0, mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    ret = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6", mem2, 90, &written2);
    if (ret != WALLY_OK || written != written2 || memcmp(mem, mem2, written) != 0)
        is_success = false;

    ret = wally_addr_segwit_to_bytes(
        "tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7",
        "tb", 0, mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    ret = wally_hex_to_bytes(
        "00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262", mem2, 90, &written2);
    if (ret != WALLY_OK || written != written2 || memcmp(mem, mem2, written) != 0)
        is_success = false;

    ret = wally_addr_segwit_to_bytes(
        "bc1pw508d6qejxtdg4y5r3zarvary0c5xw7kw508d6qejxtdg4y5r3zarvary0c5xw7kt5nd6y",
        "bc", 0, mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    ret = wally_hex_to_bytes(
        "5128751e76e8199196d454941c45d1b3a323f1433bd6751e76e8199196d454941c45d1b3a323f1433bd6", mem2, 90, &written2);
    if (ret != WALLY_OK || written != written2 || memcmp(mem, mem2, written) != 0)
        is_success = false;

    ret = wally_addr_segwit_to_bytes(
        "BC1SW50QGDZ25J",
        "bc", 0, mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    ret = wally_hex_to_bytes("6002751e", mem2, 90, &written2);
    if (ret != WALLY_OK || written != written2 || memcmp(mem, mem2, written) != 0)
        is_success = false;

    ret = wally_addr_segwit_to_bytes(
        "bc1zw508d6qejxtdg4y5r3zarvaryvaxxpcs",
        "bc", 0, mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    ret = wally_hex_to_bytes("5210751e76e8199196d454941c45d1b3a323", mem2, 90, &written2);
    if (ret != WALLY_OK || written != written2 || memcmp(mem, mem2, written) != 0)
        is_success = false;

    ret = wally_addr_segwit_to_bytes(
        "tb1qqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesrxh6hy",
        "tb", 0, mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    ret = wally_hex_to_bytes(
        "0020000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433", mem2, 90, &written2);
    if (ret != WALLY_OK || written != written2 || memcmp(mem, mem2, written) != 0)
        is_success = false;

    ret = wally_addr_segwit_to_bytes(
        "tb1pqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesf3hn0c",
        "tb", 0, mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    ret = wally_hex_to_bytes(
        "5120000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433", mem2, 90, &written2);
    if (ret != WALLY_OK || written != written2 || memcmp(mem, mem2, written) != 0)
        is_success = false;

    ret = wally_addr_segwit_to_bytes(
        "bc1p0xlxvlhemja6c4dqv22uapctqupfhlxm9h8z3k2e72q4k9hcz7vqzk5jj0",
        "bc", 0, mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    ret = wally_hex_to_bytes(
        "512079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798", mem2, 90, &written2);
    if (ret != WALLY_OK || written != written2 || memcmp(mem, mem2, written) != 0)
        is_success = false;

    free(mem);
    free(mem2);

    return is_success;
}